

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cCopyImageTests.cpp
# Opt level: O3

bool gl4cts::CopyImage::compareR11FG11FB10F(void *ptr1,void *ptr2,int num)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  float value1 [3];
  float value2 [3];
  float local_48 [6];
  
  uVar2 = num >> 2;
  if (0 < (int)uVar2) {
    uVar3 = 0;
    bVar4 = false;
    do {
      r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr1 + uVar3 * 4),local_48);
      r11fg11fb10f_to_float3(*(r11fg11fb10f *)((long)ptr2 + uVar3 * 4),local_48 + 3);
      lVar1 = 0;
      do {
        if (local_48[lVar1] != local_48[lVar1 + 3]) {
          return bVar4;
        }
        if (NAN(local_48[lVar1]) || NAN(local_48[lVar1 + 3])) {
          return bVar4;
        }
        lVar1 = lVar1 + 1;
      } while (lVar1 != 3);
      uVar3 = uVar3 + 1;
      bVar4 = uVar2 <= uVar3;
    } while (uVar3 != uVar2);
  }
  return true;
}

Assistant:

bool compareR11FG11FB10F(const void* ptr1, const void* ptr2, int num)
{
	r11fg11fb10f* data1 = (r11fg11fb10f*)ptr1;
	r11fg11fb10f* data2 = (r11fg11fb10f*)ptr2;

	float value1[3];
	float value2[3];

	for (int i = 0; i<num>> 2; ++i)
	{
		r11fg11fb10f_to_float3(data1[i], value1);
		r11fg11fb10f_to_float3(data2[i], value2);

		for (int j = 0; j < 3; ++j)
		{
			if (value1[j] != value2[j])
			{
				return false;
			}
		}
	}
	return true;
}